

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O3

ITexture * __thiscall
irr::video::CNullDriver::addTextureCubemap
          (CNullDriver *this,u32 sideLen,path *name,ECOLOR_FORMAT format)

{
  code *pcVar1;
  _func_int *p_Var2;
  IImage *pIVar3;
  bool bVar4;
  ITexture *pIVar5;
  undefined4 extraout_var;
  CNullDriver *pCVar6;
  int iVar7;
  int i;
  long lVar8;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  SSurface s;
  array<irr::video::IImage_*> imageArray;
  SSurface local_78;
  dimension2d<unsigned_int> local_70;
  undefined1 local_68 [16];
  pointer local_58;
  bool local_50;
  path *local_40;
  CNullDriver *local_38;
  
  if (sideLen == 0) {
    return (ITexture *)0x0;
  }
  if ((int)(name->str)._M_string_length == 0) {
    os::Printer::log((Printer *)"Could not create ITexture, texture needs to have a non-empty name."
                     ,(double)CONCAT44(in_XMM0_Db,in_XMM0_Da));
    return (ITexture *)0x0;
  }
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = (pointer)0x0;
  local_58 = (pointer)0x0;
  local_50 = true;
  local_40 = name;
  local_38 = this;
  std::vector<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>::reserve
            ((vector<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_> *)local_68,6);
  iVar7 = 6;
  do {
    pIVar5 = (ITexture *)operator_new(0x50);
    local_70.Width = sideLen;
    local_70.Height = sideLen;
    CImage::CImage((CImage *)pIVar5,format,&local_70);
    pCVar6 = (CNullDriver *)local_68;
    local_78.Surface = pIVar5;
    ::std::vector<irr::video::IImage*,std::allocator<irr::video::IImage*>>::
    emplace_back<irr::video::IImage*>
              ((vector<irr::video::IImage*,std::allocator<irr::video::IImage*>> *)pCVar6,
               (IImage **)&local_78);
    local_50 = false;
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  bVar4 = checkImage(pCVar6,(array<irr::video::IImage_*> *)local_68);
  pCVar6 = local_38;
  if (bVar4) {
    iVar7 = (*(local_38->super_IVideoDriver)._vptr_IVideoDriver[0x76])(local_38,local_40,local_68);
    pIVar5 = (ITexture *)CONCAT44(extraout_var,iVar7);
    if (pIVar5 != (ITexture *)0x0) {
      pcVar1 = ((IImage *)&pIVar5->_vptr_ITexture)->_vptr_IImage[-3] + 8 +
               (long)&(pIVar5->NamedPath).Path.str;
      *(int *)pcVar1 = *(int *)pcVar1 + 1;
      local_78.Surface = pIVar5;
      core::array<irr::video::CNullDriver::SSurface>::push_back
                ((array<irr::video::CNullDriver::SSurface> *)
                 &(pCVar6->super_IVideoDriver).field_0x10,&local_78);
      p_Var2 = ((IImage *)&pIVar5->_vptr_ITexture)->_vptr_IImage[-3];
      pcVar1 = p_Var2 + 8 + (long)&(pIVar5->NamedPath).Path.str;
      *(int *)pcVar1 = *(int *)pcVar1 + -1;
      if (*(int *)pcVar1 == 0) {
        (**(code **)(*(long *)((long)&((IImage *)&pIVar5->_vptr_ITexture)->_vptr_IImage +
                              (long)p_Var2) + 8))();
      }
      goto LAB_001ca078;
    }
  }
  pIVar5 = (ITexture *)0x0;
LAB_001ca078:
  lVar8 = 0;
  do {
    pIVar3 = *(pointer)(local_68._0_8_ + lVar8 * 8);
    p_Var2 = pIVar3->_vptr_IImage[-3];
    pcVar1 = p_Var2 + 4 + (long)&(pIVar3->Size).Width;
    *(int *)pcVar1 = *(int *)pcVar1 + -1;
    if (*(int *)pcVar1 == 0) {
      (**(code **)(*(long *)((long)&pIVar3->_vptr_IImage + (long)p_Var2) + 8))();
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 6);
  if ((pointer)local_68._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_68._0_8_,(long)local_58 - local_68._0_8_);
    return pIVar5;
  }
  return pIVar5;
}

Assistant:

ITexture *CNullDriver::addTextureCubemap(const irr::u32 sideLen, const io::path &name, ECOLOR_FORMAT format)
{
	if (0 == sideLen)
		return 0;

	if (0 == name.size()) {
		os::Printer::log("Could not create ITexture, texture needs to have a non-empty name.", ELL_WARNING);
		return 0;
	}

	core::array<IImage *> imageArray(6);
	for (int i = 0; i < 6; ++i)
		imageArray.push_back(new CImage(format, core::dimension2du(sideLen, sideLen)));

	ITexture *t = 0;
	if (checkImage(imageArray)) {
		t = createDeviceDependentTextureCubemap(name, imageArray);

		if (t) {
			addTexture(t);
			t->drop();
		}
	}

	for (int i = 0; i < 6; ++i)
		imageArray[i]->drop();

	return t;
}